

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceGraph.cc
# Opt level: O3

vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_> * __thiscall
DistanceGraph::find_all_paths_between
          (vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
           *__return_storage_ptr__,DistanceGraph *this,sgNodeID_t from,sgNodeID_t to,
          int64_t max_size,int max_nodes,bool abort_on_loops)

{
  sgNodeID_t sVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int64_t iVar4;
  bool bVar5;
  int64_t iVar6;
  undefined4 uVar7;
  int iVar8;
  pointer pTVar9;
  ulong uVar10;
  pointer pTVar11;
  ulong uVar12;
  ostream *poVar13;
  vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_> *pvVar14;
  pointer pTVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  pointer pLVar19;
  SequenceDistanceGraph *__args;
  long lVar20;
  pointer pLVar21;
  _Vector_base<T,_std::allocator<T>_> *p_Var22;
  ulong uVar23;
  pointer pTVar24;
  size_type __new_size;
  vector<Link,_std::allocator<Link>_> fwl;
  vector<long,_std::allocator<long>_> pp;
  pointer local_e0;
  pointer local_d8;
  vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_> local_a8;
  ulong local_90;
  ulong local_88;
  vector<Link,_std::allocator<Link>_> local_80;
  vector<long,_std::allocator<long>_> local_68;
  pointer local_48;
  sgNodeID_t local_40;
  size_type local_38;
  
  local_88 = max_size;
  pTVar9 = (pointer)operator_new(3200000);
  local_e0 = pTVar9 + 100000;
  local_a8.super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_40 = from;
  get_fw_links(&local_80,this,from);
  local_d8 = pTVar9;
  if (local_80.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_80.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_48 = local_80.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
               super__Vector_impl_data._M_finish;
    pLVar21 = local_80.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
              super__Vector_impl_data._M_start;
    pLVar19 = local_80.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
              super__Vector_impl_data._M_finish;
    do {
      lVar16 = pLVar21->dest;
      if (lVar16 == to) {
        __args = this->sdg;
        if (local_a8.
            super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_a8.
            super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
            ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0017a75f;
        std::vector<SequenceDistanceGraphPath,std::allocator<SequenceDistanceGraphPath>>::
        emplace_back<SequenceDistanceGraph&,std::vector<long,std::allocator<long>>&>
                  ((vector<SequenceDistanceGraphPath,std::allocator<SequenceDistanceGraphPath>> *)
                   &local_a8,__args,&local_68);
      }
      else {
        __args = this->sdg;
LAB_0017a75f:
        lVar18 = -lVar16;
        if (0 < lVar16) {
          lVar18 = lVar16;
        }
        uVar23 = (__args->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar18].sequence._M_string_length;
        if (uVar23 <= local_88) {
          if (local_d8 == local_e0) {
            uVar12 = (long)local_d8 - (long)pTVar9;
            if (uVar12 == 0x7fffffffffffffe0) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar10 = (long)uVar12 >> 5;
            uVar17 = uVar10;
            if (local_d8 == pTVar9) {
              uVar17 = 1;
            }
            p_Var22 = (_Vector_base<T,_std::allocator<T>_> *)(uVar17 + uVar10);
            if ((_Vector_base<T,_std::allocator<T>_> *)0x3fffffffffffffe < p_Var22) {
              p_Var22 = (_Vector_base<T,_std::allocator<T>_> *)0x3ffffffffffffff;
            }
            if (CARRY8(uVar17,uVar10)) {
              p_Var22 = (_Vector_base<T,_std::allocator<T>_> *)0x3ffffffffffffff;
            }
            pTVar11 = std::_Vector_base<T,_std::allocator<T>_>::_M_allocate(p_Var22,(size_t)__args);
            sVar1 = pLVar21->dest;
            *(undefined8 *)((long)pTVar11 + uVar12) = 0xffffffffffffffff;
            *(sgNodeID_t *)((long)pTVar11 + uVar12 + 8) = sVar1;
            *(undefined4 *)((long)pTVar11 + uVar12 + 0x10) = 1;
            *(ulong *)((long)pTVar11 + uVar12 + 0x18) = uVar23;
            pTVar24 = pTVar11;
            for (pTVar15 = pTVar9; local_d8 != pTVar15; pTVar15 = pTVar15 + 1) {
              iVar6 = pTVar15->prev;
              uVar2 = *(undefined4 *)((long)&pTVar15->prev + 4);
              sVar1 = pTVar15->node;
              uVar3 = *(undefined4 *)((long)&pTVar15->node + 4);
              uVar7 = *(undefined4 *)&pTVar15->field_0x14;
              iVar4 = pTVar15->partial_size;
              pTVar24->node_count = pTVar15->node_count;
              *(undefined4 *)&pTVar24->field_0x14 = uVar7;
              pTVar24->partial_size = iVar4;
              *(int *)&pTVar24->prev = (int)iVar6;
              *(undefined4 *)((long)&pTVar24->prev + 4) = uVar2;
              *(int *)&pTVar24->node = (int)sVar1;
              *(undefined4 *)((long)&pTVar24->node + 4) = uVar3;
              pTVar24 = pTVar24 + 1;
            }
            if (pTVar9 != (pointer)0x0) {
              operator_delete(pTVar9,uVar12);
            }
            local_d8 = pTVar24 + 1;
            local_e0 = pTVar11 + (long)p_Var22;
            pTVar9 = pTVar11;
            pLVar19 = local_48;
          }
          else {
            local_d8->prev = -1;
            local_d8->node = lVar16;
            local_d8->node_count = 1;
            local_d8->partial_size = uVar23;
            local_d8 = local_d8 + 1;
          }
        }
      }
      pLVar21 = pLVar21 + 1;
    } while (pLVar21 != pLVar19);
  }
  if (local_80.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((local_d8 != pTVar9) && ((ulong)((long)local_d8 - (long)pTVar9) < 0x1e84820)) {
    uVar23 = 0;
    while ((ulong)((long)local_a8.
                         super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_a8.
                        super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
                        ._M_impl.super__Vector_impl_data._M_start) < 0x7d20) {
      iVar8 = pTVar9[uVar23].node_count;
      __new_size = (size_type)iVar8;
      local_48 = (pointer)pTVar9[uVar23].partial_size;
      get_fw_links(&local_80,this,pTVar9[uVar23].node);
      pLVar21 = local_80.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (local_80.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.super__Vector_impl_data.
          _M_start ==
          local_80.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        bVar5 = true;
      }
      else {
        iVar8 = iVar8 + 1;
        pLVar19 = local_80.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_90 = uVar23;
        local_38 = __new_size;
        do {
          lVar16 = pLVar19->dest;
          if (lVar16 == to) {
            std::vector<long,_std::allocator<long>_>::resize(&local_68,__new_size);
            for (uVar12 = uVar23; uVar12 != 0xffffffffffffffff; uVar12 = pTVar9[uVar12].prev) {
              local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start[(long)pTVar9[uVar12].node_count + -1] =
                   pTVar9[uVar12].node;
            }
            if ((abort_on_loops) &&
               ((long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start != 0)) {
              lVar16 = (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_start >> 3;
              lVar16 = lVar16 + (ulong)(lVar16 == 0);
              lVar18 = 0;
              do {
                lVar20 = 0;
                do {
                  if (local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar18] ==
                      local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar20]) {
                    (__return_storage_ptr__->
                    super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
                    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    (__return_storage_ptr__->
                    super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
                    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    (__return_storage_ptr__->
                    super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    bVar5 = false;
                    goto LAB_0017aba5;
                  }
                  lVar20 = lVar20 + 1;
                } while (lVar16 != lVar20);
                lVar18 = lVar18 + 1;
              } while (lVar18 != lVar16);
            }
            std::vector<SequenceDistanceGraphPath,std::allocator<SequenceDistanceGraphPath>>::
            emplace_back<SequenceDistanceGraph&,std::vector<long,std::allocator<long>>&>
                      ((vector<SequenceDistanceGraphPath,std::allocator<SequenceDistanceGraphPath>>
                        *)&local_a8,this->sdg,&local_68);
          }
          else {
            lVar18 = -lVar16;
            if (0 < lVar16) {
              lVar18 = lVar16;
            }
            uVar12 = (long)&local_48->source +
                     (this->sdg->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar18].sequence._M_string_length +
                     (long)pLVar19->dist;
            uVar23 = local_90;
            if (uVar12 <= local_88 && (int)__new_size <= max_nodes) {
              if (local_d8 == local_e0) {
                uVar23 = (long)local_d8 - (long)pTVar9;
                if (uVar23 == 0x7fffffffffffffe0) {
                  std::__throw_length_error("vector::_M_realloc_insert");
                }
                uVar10 = (long)uVar23 >> 5;
                uVar17 = uVar10;
                if (local_d8 == pTVar9) {
                  uVar17 = 1;
                }
                p_Var22 = (_Vector_base<T,_std::allocator<T>_> *)(uVar17 + uVar10);
                if ((_Vector_base<T,_std::allocator<T>_> *)0x3fffffffffffffe < p_Var22) {
                  p_Var22 = (_Vector_base<T,_std::allocator<T>_> *)0x3ffffffffffffff;
                }
                if (CARRY8(uVar17,uVar10)) {
                  p_Var22 = (_Vector_base<T,_std::allocator<T>_> *)0x3ffffffffffffff;
                }
                pTVar11 = std::_Vector_base<T,_std::allocator<T>_>::_M_allocate
                                    (p_Var22,lVar18 * 0x38);
                sVar1 = pLVar19->dest;
                *(ulong *)((long)pTVar11 + uVar23) = local_90;
                *(sgNodeID_t *)((long)pTVar11 + uVar23 + 8) = sVar1;
                *(int *)((long)pTVar11 + uVar23 + 0x10) = iVar8;
                *(ulong *)((long)pTVar11 + uVar23 + 0x18) = uVar12;
                pTVar24 = pTVar11;
                for (pTVar15 = pTVar9; local_d8 != pTVar15; pTVar15 = pTVar15 + 1) {
                  iVar6 = pTVar15->prev;
                  uVar2 = *(undefined4 *)((long)&pTVar15->prev + 4);
                  sVar1 = pTVar15->node;
                  uVar3 = *(undefined4 *)((long)&pTVar15->node + 4);
                  uVar7 = *(undefined4 *)&pTVar15->field_0x14;
                  iVar4 = pTVar15->partial_size;
                  pTVar24->node_count = pTVar15->node_count;
                  *(undefined4 *)&pTVar24->field_0x14 = uVar7;
                  pTVar24->partial_size = iVar4;
                  *(int *)&pTVar24->prev = (int)iVar6;
                  *(undefined4 *)((long)&pTVar24->prev + 4) = uVar2;
                  *(int *)&pTVar24->node = (int)sVar1;
                  *(undefined4 *)((long)&pTVar24->node + 4) = uVar3;
                  pTVar24 = pTVar24 + 1;
                }
                if (pTVar9 != (pointer)0x0) {
                  operator_delete(pTVar9,uVar23);
                }
                local_e0 = pTVar11 + (long)p_Var22;
              }
              else {
                local_d8->prev = local_90;
                local_d8->node = lVar16;
                local_d8->node_count = iVar8;
                local_d8->partial_size = uVar12;
                pTVar11 = pTVar9;
                pTVar24 = local_d8;
              }
              local_d8 = pTVar24 + 1;
              pTVar9 = pTVar11;
              uVar23 = local_90;
              __new_size = local_38;
            }
          }
          pLVar19 = pLVar19 + 1;
        } while (pLVar19 != pLVar21);
        bVar5 = true;
      }
LAB_0017aba5:
      if (local_80.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_80.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_80.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_80.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (!bVar5) goto LAB_0017ae0a;
      uVar23 = uVar23 + 1;
      uVar12 = (long)local_d8 - (long)pTVar9 >> 5;
      if ((uVar12 <= uVar23) || (1000000 < uVar12)) break;
    }
  }
  pvVar14 = __return_storage_ptr__;
  if ((long)local_d8 - (long)pTVar9 == 32000000) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"From ",5);
    poVar13 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13," to ",4);
    poVar13 = std::ostream::_M_insert<long>((long)poVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13," with max_size ",0xf);
    poVar13 = std::ostream::_M_insert<long>((long)poVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13," and max_nodes ",0xf);
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,max_nodes);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13," there were too many nodes!",0x1b);
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    if ((long)local_a8.
              super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_a8.
              super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
              ._M_impl.super__Vector_impl_data._M_start != 32000) goto LAB_0017adfc;
  }
  else if ((long)local_a8.
                 super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_a8.
                 super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
                 ._M_impl.super__Vector_impl_data._M_start != 32000) {
    (__return_storage_ptr__->
    super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>).
    _M_impl.super__Vector_impl_data._M_start =
         local_a8.
         super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->
    super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>).
    _M_impl.super__Vector_impl_data._M_finish =
         local_a8.
         super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->
    super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_a8.
         super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar14 = &local_a8;
    goto LAB_0017adfc;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"From ",5);
  poVar13 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13," to ",4);
  poVar13 = std::ostream::_M_insert<long>((long)poVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13," with max_size ",0xf);
  poVar13 = std::ostream::_M_insert<long>((long)poVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13," and max_nodes ",0xf);
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,max_nodes);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13," there were too many paths!",0x1b);
  std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
  std::ostream::put((char)poVar13);
  std::ostream::flush();
LAB_0017adfc:
  (pvVar14->
  super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar14->
  super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar14->
  super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_0017ae0a:
  if (local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>::~vector
            (&local_a8);
  if (pTVar9 != (pointer)0x0) {
    operator_delete(pTVar9,(long)local_e0 - (long)pTVar9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SequenceDistanceGraphPath> DistanceGraph::find_all_paths_between(sgNodeID_t from,sgNodeID_t to, int64_t max_size, int max_nodes, bool abort_on_loops) const {
    typedef struct T {
        int64_t prev;
        sgNodeID_t node;
        int node_count;
        int64_t partial_size;
        T(uint64_t a, sgNodeID_t b, int c, int64_t d) : prev(a),node(b),node_count(c),partial_size(d){};
    } pathNodeEntry_t;

    std::vector<pathNodeEntry_t> node_entries;
    node_entries.reserve(100000);
    std::vector<SequenceDistanceGraphPath> final_paths;
    std::vector<sgNodeID_t> pp;

    for(auto &fl:get_fw_links(from)) {
        if (fl.dest==to and final_paths.empty()) {
            final_paths.emplace_back(sdg,pp);
        }
        else if (sdg.nodes[llabs(fl.dest)].sequence.size()<=max_size) {
            node_entries.emplace_back(-1, fl.dest, 1, sdg.nodes[llabs(fl.dest)].sequence.size());
        }
    }


    // XXX: This loop is growing forever on node 2083801 for backbone 58, the limits are heuristics to cap the complexity of regions captured
    for (uint64_t current_index=0;current_index<node_entries.size() and node_entries.size() < 1000001 and final_paths.size() < 1001;++current_index){
        auto current_entry=node_entries[current_index];
        auto fwl=get_fw_links(current_entry.node);
        for(auto &fl:fwl) {
            if (fl.dest==to){
                //reconstruct path backwards
                pp.resize(current_entry.node_count);

                for (uint64_t ei=current_index;ei!=-1;ei=node_entries[ei].prev){
                    pp[node_entries[ei].node_count-1]=node_entries[ei].node;
                }
                //check if there are any loops
                if (abort_on_loops) {
                    for (auto i1 = 0; i1 < pp.size(); ++i1) {
                        for (auto i2 = 0; i2 < pp.size(); ++i2) {
                            if (pp[i1]==pp[i2]) {
                                return {};
                            }
                        }
                    }
                }
                //add to solutions
                final_paths.emplace_back(sdg,pp);
            }
            else {
                uint64_t new_size=current_entry.partial_size+fl.dist+sdg.nodes[llabs(fl.dest)].sequence.size();
                if (new_size<=max_size and current_entry.node_count<=max_nodes) {
                    node_entries.emplace_back(current_index, fl.dest, current_entry.node_count+1, new_size);
                }
            }
        }

    }

    bool early_exit=false;
    if (node_entries.size() == 1000000) {
        std::cout << "From " << from << " to " << to << " with max_size " << max_size << " and max_nodes " << max_nodes << " there were too many nodes!"<< std::endl;
        early_exit = true;
    }

    if (final_paths.size() == 1000) {
        std::cout << "From " << from << " to " << to << " with max_size " << max_size << " and max_nodes " << max_nodes << " there were too many paths!"<< std::endl;
        early_exit = true;
    }

    if (early_exit) return {};
    return final_paths;
}